

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNQIn.cpp
# Opt level: O0

void __thiscall NaPNQueueInput::action(NaPNQueueInput *this)

{
  int iVar1;
  NaVector *pNVar2;
  undefined4 extraout_var;
  long in_RDI;
  NaVector *unaff_retaddr;
  uint i;
  undefined8 in_stack_ffffffffffffffd8;
  NaVector *in_stack_ffffffffffffffe0;
  uint local_c;
  long lVar3;
  uint n;
  
  lVar3 = in_RDI;
  for (local_c = 0; n = (uint)((ulong)lVar3 >> 0x20), local_c < *(uint *)(in_RDI + 0xe0);
      local_c = local_c + 1) {
    in_stack_ffffffffffffffe0 =
         (NaVector *)
         NaVector::operator()
                   (in_stack_ffffffffffffffe0,(uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    pNVar2 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x48));
    iVar1 = (*pNVar2->_vptr_NaVector[8])(pNVar2,(ulong)local_c);
    *(NaVector **)CONCAT44(extraout_var,iVar1) = in_stack_ffffffffffffffe0;
  }
  NaVector::shift(unaff_retaddr,n);
  NaVector::dim((NaVector *)(in_RDI + 200));
  NaVector::new_dim(unaff_retaddr,n);
  return;
}

Assistant:

void
NaPNQueueInput::action ()
{
  unsigned	i;

  // Get data from the queue
  for(i = 0; i < nDataSize; ++i){
    out.data()[i] = vQueue(i);
  }

  // Remove data portion
  vQueue.shift(- (int)nDataSize);
  vQueue.new_dim(vQueue.dim() - nDataSize);
}